

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_VecStr.cpp
# Opt level: O1

void __thiscall mbc::Val::VecStr::VecStr(VecStr *this)

{
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfVar1;
  string *psVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  _func_bool__Any_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *__tmp_1;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  
  _ValAtom::_ValAtom(&this->super__ValAtom);
  (this->super__ValAtom).super_ValBase._vptr_ValBase = (_func_int **)&PTR__VecStr_001409f8;
  pvVar3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)operator_new(0x18);
  (pvVar3->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar3->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar3->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->value_ = pvVar3;
  pfVar1 = (this->super__ValAtom).vaild_checker_;
  local_48._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pfVar1->super__Function_base)._M_functor;
  local_48._8_8_ = *(undefined8 *)((long)&(pfVar1->super__Function_base)._M_functor + 8);
  *(undefined8 *)&(pfVar1->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(pfVar1->super__Function_base)._M_functor + 8) = 0;
  local_38 = (pfVar1->super__Function_base)._M_manager;
  (pfVar1->super__Function_base)._M_manager =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_VecStr.cpp:26:24)>
       ::_M_manager;
  local_30 = pfVar1->_M_invoker;
  pfVar1->_M_invoker =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/val_VecStr.cpp:26:24)>
       ::_M_invoke;
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  psVar2 = (this->super__ValAtom).super_ValBase.invaild_waring_;
  std::__cxx11::string::_M_replace((ulong)psVar2,0,(char *)psVar2->_M_string_length,0x1322da);
  *(this->super__ValAtom).super_ValBase.type_ = VECSTR;
  local_48._M_unused._M_object = &local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"[]","");
  _ValAtom::set(&this->super__ValAtom,(string *)&local_48);
  if ((_Manager_type *)local_48._M_unused._0_8_ != &local_38) {
    operator_delete(local_48._M_unused._M_object);
  }
  return;
}

Assistant:

VecStr::VecStr() : _ValAtom() {
    value_          = new vector<string>();

    *vaild_checker_  = [](const string& str){return true;};
    *invaild_waring_ = "[invaild vecstr]";
    *type_           = Type(VECSTR);
    
    set("[]");
}